

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vkImageUtil.cpp
# Opt level: O2

FilterMode vk::mapVkMagTexFilter(VkFilter filter)

{
  VkFilter VVar1;
  
  VVar1 = 6;
  if (filter == VK_FILTER_NEAREST) {
    VVar1 = filter;
  }
  if (filter == VK_FILTER_LINEAR) {
    VVar1 = filter;
  }
  return VVar1;
}

Assistant:

tcu::Sampler::FilterMode mapVkMagTexFilter (VkFilter filter)
{
	switch (filter)
	{
		case VK_FILTER_LINEAR:		return tcu::Sampler::LINEAR;
		case VK_FILTER_NEAREST:		return tcu::Sampler::NEAREST;
		default:
			break;
	}

	DE_ASSERT(false);
	return tcu::Sampler::FILTERMODE_LAST;
}